

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O2

void __thiscall
google::protobuf::MethodDescriptorProto::set_output_type(MethodDescriptorProto *this,char *value)

{
  Arena *arena;
  allocator local_31;
  string local_30;
  
  *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
  std::__cxx11::string::string((string *)&local_30,value,&local_31);
  arena = (Arena *)(this->_internal_metadata_).
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   .ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
  }
  internal::ArenaStringPtr::Set
            (&this->output_type_,(string *)internal::fixed_address_empty_string_abi_cxx11_,&local_30
             ,arena);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

inline void MethodDescriptorProto::set_output_type(const char* value) {
  GOOGLE_DCHECK(value != nullptr);
  _has_bits_[0] |= 0x00000004u;
  output_type_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), ::std::string(value),
              GetArenaNoVirtual());
  // @@protoc_insertion_point(field_set_char:google.protobuf.MethodDescriptorProto.output_type)
}